

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

void Flush(VP8BitWriter *bw)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  
  bVar2 = (char)bw->nb_bits + 8;
  uVar3 = bw->value >> (bVar2 & 0x1f);
  bw->value = bw->value - (uVar3 << (bVar2 & 0x1f));
  bw->nb_bits = bw->nb_bits + -8;
  if ((uint8_t)uVar3 == 0xff) {
    bw->run = bw->run + 1;
  }
  else {
    sVar4 = bw->pos;
    iVar1 = BitWriterResize(bw,(long)bw->run + 1);
    if (iVar1 != 0) {
      if ((sVar4 != 0 & (byte)(uVar3 >> 8)) == 1) {
        bw->buf[sVar4 - 1] = bw->buf[sVar4 - 1] + '\x01';
      }
      iVar1 = bw->run;
      if (0 < iVar1) {
        while (0 < iVar1) {
          bw->buf[sVar4] = ((uVar3 >> 8 & 1) != 0) + 0xff;
          sVar4 = sVar4 + 1;
          iVar1 = bw->run + -1;
          bw->run = iVar1;
        }
      }
      bw->buf[sVar4] = (uint8_t)uVar3;
      bw->pos = sVar4 + 1;
    }
  }
  return;
}

Assistant:

static void Flush(VP8BitWriter* const bw) {
  const int s = 8 + bw->nb_bits;
  const int32_t bits = bw->value >> s;
  assert(bw->nb_bits >= 0);
  bw->value -= bits << s;
  bw->nb_bits -= 8;
  if ((bits & 0xff) != 0xff) {
    size_t pos = bw->pos;
    if (!BitWriterResize(bw, bw->run + 1)) {
      return;
    }
    if (bits & 0x100) {  // overflow -> propagate carry over pending 0xff's
      if (pos > 0) bw->buf[pos - 1]++;
    }
    if (bw->run > 0) {
      const int value = (bits & 0x100) ? 0x00 : 0xff;
      for (; bw->run > 0; --bw->run) bw->buf[pos++] = value;
    }
    bw->buf[pos++] = bits & 0xff;
    bw->pos = pos;
  } else {
    bw->run++;   // delay writing of bytes 0xff, pending eventual carry.
  }
}